

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrivial(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  ulong extraout_RDX;
  Type type_00;
  
  if (type.id < 2) {
    if (type.id == 0) {
      pEVar2 = (Expression *)
               MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x10,8);
      pEVar2->_id = NopId;
      (pEVar2->type).id = 0;
    }
    else {
      wasm::HeapType::getSignature();
      if (extraout_RDX < 2) {
        pEVar3 = (Expression *)0x0;
      }
      else {
        wasm::HeapType::getSignature();
        pEVar3 = makeTrivial(this,type_00);
      }
      pEVar2 = (Expression *)
               MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x18,8);
      pEVar2->_id = ReturnId;
      (pEVar2->type).id = 1;
      *(Expression **)(pEVar2 + 1) = pEVar3;
    }
    return pEVar2;
  }
  uVar1 = Random::upTo(&this->random,2);
  if ((uVar1 == 0) && (this->funcContext != (FunctionCreationContext *)0x0)) {
    pEVar2 = makeLocalGet(this,type);
    return pEVar2;
  }
  pEVar2 = makeConst(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrivial(Type type) {
  if (type.isConcrete()) {
    if (oneIn(2) && funcContext) {
      return makeLocalGet(type);
    } else {
      return makeConst(type);
    }
  } else if (type == Type::none) {
    return makeNop(type);
  }
  assert(type == Type::unreachable);
  Expression* ret = nullptr;
  if (funcContext->func->getResults().isConcrete()) {
    ret = makeTrivial(funcContext->func->getResults());
  }
  return builder.makeReturn(ret);
}